

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCircleProfileDef::IfcCircleProfileDef(IfcCircleProfileDef *this)

{
  IfcCircleProfileDef *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x88,"IfcCircleProfileDef");
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,&PTR_construction_vtable_24__00f0b960);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCircleProfileDef,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCircleProfileDef,_1UL> *)
             &(this->super_IfcParameterizedProfileDef).field_0x70,
             &PTR_construction_vtable_24__00f0b9a8);
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xf0b8d0;
  *(undefined8 *)&this->field_0x88 = 0xf0b948;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 = 0xf0b8f8
  ;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0xf0b920;
  return;
}

Assistant:

IfcCircleProfileDef() : Object("IfcCircleProfileDef") {}